

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFileUnpacker.cpp
# Opt level: O2

string * __thiscall
DatUnpacker::DatFileUnpacker::getErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,DatFileUnpacker *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string DatFileUnpacker::getErrorMessage() const
    {
        return _errorMessage;
    }